

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

void __thiscall soplex::SPxDevexPR<double>::setupWeights(SPxDevexPR<double> *this,Type tp)

{
  VectorBase<double> *this_00;
  SPxSolverBase<double> *pSVar1;
  SPxSolverBase<double> *pSVar2;
  ulong uVar3;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  this_00 = &pSVar1->coWeights;
  VectorBase<double>::reDim(this_00,(pSVar1->thecovectors->set).thenum,false);
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  uVar3 = (ulong)(uint)(pSVar2->thecovectors->set).thenum;
  if (tp == ENTER) {
    for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3 - 1] = 2.0;
    }
    VectorBase<double>::reDim(&pSVar1->weights,(pSVar2->thevectors->set).thenum,false);
    pSVar2 = (this->super_SPxPricer<double>).thesolver;
    for (uVar3 = (ulong)(uint)(pSVar2->thevectors->set).thenum; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3 - 1] = 2.0;
    }
  }
  else {
    for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3 - 1] = 1.0;
    }
  }
  pSVar2->weightsAreSetup = true;
  return;
}

Assistant:

void SPxDevexPR<R>::setupWeights(typename SPxSolverBase<R>::Type tp)
{
   int i;
   int coWeightSize = 0;
   int weightSize = 0;

   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(tp == SPxSolverBase<R>::ENTER)
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 2.0;

      weights.reDim(this->thesolver->coDim(), false);

      for(i = this->thesolver->coDim() - 1; i >= weightSize; --i)
         weights[i] = 2.0;
   }
   else
   {
      coWeights.reDim(this->thesolver->dim(), false);

      for(i = this->thesolver->dim() - 1; i >= coWeightSize; --i)
         coWeights[i] = 1.0;
   }

   this->thesolver->weightsAreSetup = true;
}